

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::GenBuilder
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *builder_name,string *code)

{
  size_type_conflict sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code_local;
  string *builder_name_local;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *non_deprecated_fields_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  
  local_30 = code;
  code_local = builder_name;
  builder_name_local = (string *)non_deprecated_fields;
  non_deprecated_fields_local =
       (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
        *)struct_def;
  struct_def_local = (StructDef *)this;
  sVar1 = std::
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          ::size(non_deprecated_fields);
  if (sVar1 != 0) {
    std::operator+(&local_70,"class ",code_local);
    std::operator+(&local_50,&local_70," {\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::operator+(&local_c0,"  ",code_local);
    std::operator+(&local_a0,&local_c0,"(this.fbBuilder);\n\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::operator+(&local_100,"  final ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _kFb_abi_cxx11_);
    std::operator+(&local_e0,&local_100,".Builder fbBuilder;\n\n");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    if (((ulong)non_deprecated_fields_local[0xb].
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 1) == 0) {
      TableBuilderBody(this,(StructDef *)non_deprecated_fields_local,
                       (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                        *)builder_name_local,local_30);
    }
    else {
      StructBuilderBody(this,(StructDef *)non_deprecated_fields_local,
                        (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                         *)builder_name_local,local_30);
    }
    std::__cxx11::string::operator+=((string *)local_30,"}\n\n");
  }
  return;
}

Assistant:

void GenBuilder(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      const std::string &builder_name, std::string &code) {
    if (non_deprecated_fields.size() == 0) { return; }

    code += "class " + builder_name + " {\n";
    code += "  " + builder_name + "(this.fbBuilder);\n\n";
    code += "  final " + _kFb + ".Builder fbBuilder;\n\n";

    if (struct_def.fixed) {
      StructBuilderBody(struct_def, non_deprecated_fields, code);
    } else {
      TableBuilderBody(struct_def, non_deprecated_fields, code);
    }

    code += "}\n\n";
  }